

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pybind11.h
# Opt level: O0

void __thiscall pybind11::detail::generic_type::initialize(generic_type *this,type_record *rec)

{
  char *pcVar1;
  initializer_list<pybind11::detail::type_info_*> __l;
  bool bVar2;
  PyObject *pPVar3;
  type_info *this_00;
  size_t sVar4;
  mapped_type *pmVar5;
  local_internals *this_01;
  mapped_type *pptVar6;
  mapped_type *this_02;
  PyTypeObject *type;
  type_info *ptVar7;
  type_info *__rhs;
  type_info *local_1f0;
  bool local_1b1;
  handle local_1b0;
  PyObject *local_1a8;
  handle local_1a0;
  list_accessor local_198;
  type_info *local_178;
  type_info *parent_tinfo;
  type_info *local_168;
  iterator local_160;
  size_type local_158;
  type_index local_150;
  type_index tindex;
  internals *internals;
  type_info *tinfo;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  type_index local_d0;
  type_index local_c8;
  allocator<char> local_b9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  byte local_41;
  str_attr_accessor local_40;
  PyObject *local_20;
  type_record *local_18;
  type_record *rec_local;
  generic_type *this_local;
  
  local_18 = rec;
  rec_local = (type_record *)this;
  bVar2 = handle::operator_cast_to_bool(&rec->scope);
  local_41 = 0;
  local_1b1 = false;
  if (bVar2) {
    local_20 = (local_18->scope).m_ptr;
    bVar2 = hasattr((handle)local_20,"__dict__");
    local_1b1 = false;
    if (bVar2) {
      object_api<pybind11::handle>::attr
                (&local_40,(object_api<pybind11::handle> *)local_18,"__dict__");
      local_41 = 1;
      local_1b1 = object_api<pybind11::detail::accessor<pybind11::detail::accessor_policies::str_attr>>
                  ::contains<char_const*const&>
                            ((object_api<pybind11::detail::accessor<pybind11::detail::accessor_policies::str_attr>>
                              *)&local_40,&local_18->name);
    }
  }
  if ((local_41 & 1) != 0) {
    accessor<pybind11::detail::accessor_policies::str_attr>::~accessor(&local_40);
  }
  if (local_1b1 != false) {
    pcVar1 = local_18->name;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_b8,pcVar1,&local_b9);
    std::operator+(&local_98,"generic_type: cannot initialize type \"",&local_b8);
    std::operator+(&local_78,&local_98,"\": an object with that name is already defined");
    pybind11_fail(&local_78);
  }
  if (((byte)local_18->field_0x60 >> 4 & 1) == 0) {
    __rhs = local_18->type;
    std::type_index::type_index(&local_d0,__rhs);
    local_1f0 = get_global_type_info(&local_d0);
  }
  else {
    __rhs = local_18->type;
    std::type_index::type_index(&local_c8,__rhs);
    local_1f0 = get_local_type_info(&local_c8);
  }
  if (local_1f0 == (type_info *)0x0) {
    pPVar3 = make_new_python_type(local_18);
    (this->super_object).super_handle.m_ptr = pPVar3;
    this_00 = (type_info *)operator_new(0x98);
    this_00->get_buffer_data = (void *)0x0;
    this_00->module_local_load = (_func_void_ptr_PyObject_ptr_type_info_ptr *)0x0;
    this_00->direct_conversions =
         (vector<bool_(*)(_object_*,_void_*&),_std::allocator<bool_(*)(_object_*,_void_*&)>_> *)0x0;
    this_00->get_buffer = (_func_buffer_info_ptr_PyObject_ptr_void_ptr *)0x0;
    (this_00->implicit_casts).
    super__Vector_base<std::pair<const_std::type_info_*,_void_*(*)(void_*)>,_std::allocator<std::pair<const_std::type_info_*,_void_*(*)(void_*)>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (this_00->implicit_casts).
    super__Vector_base<std::pair<const_std::type_info_*,_void_*(*)(void_*)>,_std::allocator<std::pair<const_std::type_info_*,_void_*(*)(void_*)>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (this_00->implicit_conversions).
    super__Vector_base<_object_*(*)(_object_*,__typeobject_*),_std::allocator<_object_*(*)(_object_*,__typeobject_*)>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (this_00->implicit_casts).
    super__Vector_base<std::pair<const_std::type_info_*,_void_*(*)(void_*)>,_std::allocator<std::pair<const_std::type_info_*,_void_*(*)(void_*)>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (this_00->implicit_conversions).
    super__Vector_base<_object_*(*)(_object_*,__typeobject_*),_std::allocator<_object_*(*)(_object_*,__typeobject_*)>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (this_00->implicit_conversions).
    super__Vector_base<_object_*(*)(_object_*,__typeobject_*),_std::allocator<_object_*(*)(_object_*,__typeobject_*)>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    this_00->init_instance = (_func_void_instance_ptr_void_ptr *)0x0;
    this_00->dealloc = (type *)0x0;
    this_00->holder_size_in_ptrs = 0;
    this_00->operator_new = (_func_void_ptr_size_t *)0x0;
    this_00->type_size = 0;
    this_00->type_align = 0;
    this_00->type = (PyTypeObject *)0x0;
    this_00->cpptype = (type_info *)0x0;
    *(undefined8 *)&this_00->field_0x90 = 0;
    type_info::type_info(this_00);
    this_00->type = (PyTypeObject *)(this->super_object).super_handle.m_ptr;
    this_00->cpptype = local_18->type;
    this_00->type_size = local_18->type_size;
    this_00->type_align = local_18->type_align;
    this_00->operator_new = local_18->operator_new;
    sVar4 = size_in_ptrs((detail *)local_18->holder_size,(size_t)__rhs);
    this_00->holder_size_in_ptrs = sVar4;
    this_00->init_instance = local_18->init_instance;
    this_00->dealloc = local_18->dealloc;
    this_00->field_0x90 = this_00->field_0x90 | 1;
    this_00->field_0x90 = this_00->field_0x90 | 2;
    this_00->field_0x90 = this_00->field_0x90 & 0xfb | (byte)local_18->field_0x60 >> 1 & 4;
    this_00->field_0x90 = this_00->field_0x90 & 0xf7 | ((byte)local_18->field_0x60 >> 4 & 1) << 3;
    tindex._M_target = (type_info *)get_internals();
    std::type_index::type_index(&local_150,local_18->type);
    pmVar5 = std::
             unordered_map<std::type_index,_std::vector<bool_(*)(_object_*,_void_*&),_std::allocator<bool_(*)(_object_*,_void_*&)>_>,_std::hash<std::type_index>,_std::equal_to<std::type_index>,_std::allocator<std::pair<const_std::type_index,_std::vector<bool_(*)(_object_*,_void_*&),_std::allocator<bool_(*)(_object_*,_void_*&)>_>_>_>_>
             ::operator[]((unordered_map<std::type_index,_std::vector<bool_(*)(_object_*,_void_*&),_std::allocator<bool_(*)(_object_*,_void_*&)>_>,_std::hash<std::type_index>,_std::equal_to<std::type_index>,_std::allocator<std::pair<const_std::type_index,_std::vector<bool_(*)(_object_*,_void_*&),_std::allocator<bool_(*)(_object_*,_void_*&)>_>_>_>_>
                           *)(tindex._M_target + 0xe0),&local_150);
    this_00->direct_conversions = pmVar5;
    if (((byte)local_18->field_0x60 >> 4 & 1) == 0) {
      pptVar6 = std::
                unordered_map<std::type_index,_pybind11::detail::type_info_*,_std::hash<std::type_index>,_std::equal_to<std::type_index>,_std::allocator<std::pair<const_std::type_index,_pybind11::detail::type_info_*>_>_>
                ::operator[]((unordered_map<std::type_index,_pybind11::detail::type_info_*,_std::hash<std::type_index>,_std::equal_to<std::type_index>,_std::allocator<std::pair<const_std::type_index,_pybind11::detail::type_info_*>_>_>
                              *)tindex._M_target,&local_150);
      *pptVar6 = this_00;
    }
    else {
      this_01 = get_local_internals();
      pptVar6 = std::
                unordered_map<std::type_index,_pybind11::detail::type_info_*,_std::hash<std::type_index>,_std::equal_to<std::type_index>,_std::allocator<std::pair<const_std::type_index,_pybind11::detail::type_info_*>_>_>
                ::operator[](&this_01->registered_types_cpp,&local_150);
      *pptVar6 = this_00;
    }
    local_160 = &local_168;
    local_158 = 1;
    parent_tinfo = (type_info *)(this->super_object).super_handle.m_ptr;
    local_168 = this_00;
    this_02 = std::
              unordered_map<_typeobject_*,_std::vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>,_std::hash<_typeobject_*>,_std::equal_to<_typeobject_*>,_std::allocator<std::pair<_typeobject_*const,_std::vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>_>_>_>
              ::operator[]((unordered_map<_typeobject_*,_std::vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>,_std::hash<_typeobject_*>,_std::equal_to<_typeobject_*>,_std::allocator<std::pair<_typeobject_*const,_std::vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>_>_>_>
                            *)(tindex._M_target + 0x38),(key_type *)&parent_tinfo);
    __l._M_len = local_158;
    __l._M_array = local_160;
    std::vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>::
    operator=(this_02,__l);
    sVar4 = list::size(&local_18->bases);
    if ((sVar4 < 2) && ((local_18->field_0x60 & 1) == 0)) {
      sVar4 = list::size(&local_18->bases);
      if (sVar4 == 1) {
        list::operator[](&local_198,&local_18->bases,0);
        type = (PyTypeObject *)
               accessor<pybind11::detail::accessor_policies::list_item>::ptr(&local_198);
        ptVar7 = get_type_info(type);
        accessor<pybind11::detail::accessor_policies::list_item>::~accessor(&local_198);
        this_00->field_0x90 = this_00->field_0x90 & 0xfd | ((byte)ptVar7->field_0x90 >> 1 & 1) << 1;
        local_178 = ptVar7;
      }
    }
    else {
      mark_parents_nonsimple(this,this_00->type);
      this_00->field_0x90 = this_00->field_0x90 & 0xfd;
    }
    if (((byte)local_18->field_0x60 >> 4 & 1) != 0) {
      this_00->module_local_load = type_caster_generic::local_load;
      handle::handle(&local_1a0,(this->super_object).super_handle.m_ptr);
      capsule::capsule((capsule *)&local_1b0,this_00,(char *)0x0,(_func_void_PyObject_ptr *)0x0);
      local_1a8 = local_1b0.m_ptr;
      setattr(local_1a0,"__pybind11_module_local_v4_clang_libstdcpp_cxxabi1002__",local_1b0);
      capsule::~capsule((capsule *)&local_1b0);
    }
    return;
  }
  pcVar1 = local_18->name;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_130,pcVar1,(allocator<char> *)((long)&tinfo + 7));
  std::operator+(&local_110,"generic_type: type \"",&local_130);
  std::operator+(&local_f0,&local_110,"\" is already registered!");
  pybind11_fail(&local_f0);
}

Assistant:

void initialize(const type_record &rec) {
        if (rec.scope && hasattr(rec.scope, "__dict__") && rec.scope.attr("__dict__").contains(rec.name))
            pybind11_fail("generic_type: cannot initialize type \"" + std::string(rec.name) +
                          "\": an object with that name is already defined");

        if ((rec.module_local ? get_local_type_info(*rec.type) : get_global_type_info(*rec.type))
            != nullptr)
            pybind11_fail("generic_type: type \"" + std::string(rec.name) +
                          "\" is already registered!");

        m_ptr = make_new_python_type(rec);

        /* Register supplemental type information in C++ dict */
        auto *tinfo = new detail::type_info();
        tinfo->type = (PyTypeObject *) m_ptr;
        tinfo->cpptype = rec.type;
        tinfo->type_size = rec.type_size;
        tinfo->type_align = rec.type_align;
        tinfo->operator_new = rec.operator_new;
        tinfo->holder_size_in_ptrs = size_in_ptrs(rec.holder_size);
        tinfo->init_instance = rec.init_instance;
        tinfo->dealloc = rec.dealloc;
        tinfo->simple_type = true;
        tinfo->simple_ancestors = true;
        tinfo->default_holder = rec.default_holder;
        tinfo->module_local = rec.module_local;

        auto &internals = get_internals();
        auto tindex = std::type_index(*rec.type);
        tinfo->direct_conversions = &internals.direct_conversions[tindex];
        if (rec.module_local)
            get_local_internals().registered_types_cpp[tindex] = tinfo;
        else
            internals.registered_types_cpp[tindex] = tinfo;
        internals.registered_types_py[(PyTypeObject *) m_ptr] = { tinfo };

        if (rec.bases.size() > 1 || rec.multiple_inheritance) {
            mark_parents_nonsimple(tinfo->type);
            tinfo->simple_ancestors = false;
        }
        else if (rec.bases.size() == 1) {
            auto parent_tinfo = get_type_info((PyTypeObject *) rec.bases[0].ptr());
            tinfo->simple_ancestors = parent_tinfo->simple_ancestors;
        }

        if (rec.module_local) {
            // Stash the local typeinfo and loader so that external modules can access it.
            tinfo->module_local_load = &type_caster_generic::local_load;
            setattr(m_ptr, PYBIND11_MODULE_LOCAL_ID, capsule(tinfo));
        }
    }